

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avs_wrapper.hpp
# Opt level: O0

char * AvisynthPluginInit3(IScriptEnvironment *env,AVS_Linkage *linkage)

{
  undefined *puVar1;
  bool bVar2;
  reference pp_Var3;
  _func_void_IScriptEnvironment_ptr **RegisterFilter;
  iterator __end1;
  iterator __begin1;
  vector<void_(*)(IScriptEnvironment_*),_std::allocator<void_(*)(IScriptEnvironment_*)>_> *__range1;
  vector<void_(*)(IScriptEnvironment_*),_std::allocator<void_(*)(IScriptEnvironment_*)>_> filters;
  AVS_Linkage *linkage_local;
  IScriptEnvironment *env_local;
  
  AVS_linkage = linkage;
  filters.
  super__Vector_base<void_(*)(IScriptEnvironment_*),_std::allocator<void_(*)(IScriptEnvironment_*)>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)linkage;
  RegisterAVSFilters();
  __end1 = std::
           vector<void_(*)(IScriptEnvironment_*),_std::allocator<void_(*)(IScriptEnvironment_*)>_>::
           begin((vector<void_(*)(IScriptEnvironment_*),_std::allocator<void_(*)(IScriptEnvironment_*)>_>
                  *)&__range1);
  RegisterFilter =
       (_func_void_IScriptEnvironment_ptr **)
       std::vector<void_(*)(IScriptEnvironment_*),_std::allocator<void_(*)(IScriptEnvironment_*)>_>
       ::end((vector<void_(*)(IScriptEnvironment_*),_std::allocator<void_(*)(IScriptEnvironment_*)>_>
              *)&__range1);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<void_(**)(IScriptEnvironment_*),_std::vector<void_(*)(IScriptEnvironment_*),_std::allocator<void_(*)(IScriptEnvironment_*)>_>_>
                                *)&RegisterFilter);
    puVar1 = Plugin::Description;
    if (!bVar2) break;
    pp_Var3 = __gnu_cxx::
              __normal_iterator<void_(**)(IScriptEnvironment_*),_std::vector<void_(*)(IScriptEnvironment_*),_std::allocator<void_(*)(IScriptEnvironment_*)>_>_>
              ::operator*(&__end1);
    (**pp_Var3)(env);
    __gnu_cxx::
    __normal_iterator<void_(**)(IScriptEnvironment_*),_std::vector<void_(*)(IScriptEnvironment_*),_std::allocator<void_(*)(IScriptEnvironment_*)>_>_>
    ::operator++(&__end1);
  }
  std::vector<void_(*)(IScriptEnvironment_*),_std::allocator<void_(*)(IScriptEnvironment_*)>_>::
  ~vector((vector<void_(*)(IScriptEnvironment_*),_std::allocator<void_(*)(IScriptEnvironment_*)>_> *
          )&__range1);
  return puVar1;
}

Assistant:

__declspec(dllexport) const char* __stdcall AvisynthPluginInit3(IScriptEnvironment* env, AVS_Linkage* linkage)
{
  AVS_linkage = linkage;
  auto filters = RegisterAVSFilters();
  for (auto &&RegisterFilter : filters) {
    RegisterFilter(env);
  }
  return Plugin::Description;
}